

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void nop_1e(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  UIntPtr UVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  uint uVar7;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') goto LAB_00117747;
  if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    iVar4 = Security(2,pMyDisasm);
    if (iVar4 != 0) {
      uVar5 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
      (pMyDisasm->Reserved_).REGOPCODE = uVar5;
      if (uVar5 == 7) {
        (pMyDisasm->Prefix).RepPrefix = '\b';
        iVar4 = Security(2,pMyDisasm);
        if (iVar4 != 0) {
          UVar3 = (pMyDisasm->Reserved_).EIP_;
          uVar7 = (uint)(*(byte *)(UVar3 + 1) >> 6);
          (pMyDisasm->Reserved_).MOD_ = uVar7;
          uVar5 = *(byte *)(UVar3 + 1) & 7;
          (pMyDisasm->Reserved_).RM_ = uVar5;
          if (uVar7 != 3) goto LAB_00117747;
          if ((char)uVar5 == '\x03') {
            (pMyDisasm->Instruction).Category = 0x170000;
            uVar6 = 0x32337262646e65;
          }
          else {
            if (uVar5 != 2) {
              return;
            }
            (pMyDisasm->Instruction).Category = 0x170000;
            uVar6 = 0x34367262646e65;
          }
          *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar6;
          (pMyDisasm->Reserved_).EIP_ = UVar3 + ((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
        }
      }
      else {
        if (uVar5 != 1) {
LAB_00117747:
          failDecode(pMyDisasm);
          return;
        }
        (pMyDisasm->Prefix).RepPrefix = '\b';
        (pMyDisasm->Instruction).Category = 0x170000;
        iVar4 = Security(2,pMyDisasm);
        if (iVar4 != 0) {
          uVar5 = (uint)(*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6);
          (pMyDisasm->Reserved_).MOD_ = uVar5;
          if (uVar5 != 3) goto LAB_00117747;
          UVar2 = (pMyDisasm->Reserved_).REX.W_;
          pcVar1 = (pMyDisasm->Instruction).Mnemonic;
          if (UVar2 == '\x01' && (pMyDisasm->Reserved_).REX.state == '\x01') {
            builtin_strncpy(pcVar1,"rdsspq",7);
            iVar4 = 0x40;
          }
          else {
            builtin_strncpy(pcVar1,"rdsspd",7);
            iVar4 = (uint)(UVar2 == '\x01') * 0x20 + 0x20;
          }
          (pMyDisasm->Reserved_).OperandSize = iVar4;
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
          (pMyDisasm->Operand2).OpType = 0x20000;
          (pMyDisasm->Operand2).OpSize = 0x40;
          (pMyDisasm->Operand2).Registers.type = 0x20;
          (pMyDisasm->Operand2).Registers.special = 4;
        }
      }
    }
  }
  else {
    (pMyDisasm->Instruction).Category = 0x1000c;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"hint_nop",9);
    iVar4 = (pMyDisasm->Reserved_).OperandSize;
    uVar5 = 0x68;
    if (iVar4 != 0x40) {
      uVar5 = iVar4 == 0x20 | 0x66;
    }
    (pMyDisasm->Reserved_).MemDecoration = uVar5;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 1;
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  }
  return;
}

Assistant:

void __bea_callspec__ nop_1e(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  else if (GV.PrefRepe == 1) {
    /* ======= prefix f3 ========= */
    if (!Security(2, pMyDisasm)) return;
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    if (GV.REGOPCODE == 1) {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      pMyDisasm->Instruction.Category = CET_INSTRUCTION;
      if (!Security(2, pMyDisasm)) return;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      if ((GV.REX.state == InUsePrefix) && (GV.REX.W_ == 1)) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdsspq");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdsspd");
        #endif
      }
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand2.OpType = REGISTER_TYPE;
      pMyDisasm->Operand2.OpSize = 64;
      pMyDisasm->Operand2.Registers.type = SPECIAL_REG;
      pMyDisasm->Operand2.Registers.special = REG2; /* SSP reg */
    }
    else if (GV.REGOPCODE == 7) {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      if (!Security(2, pMyDisasm)) return;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      GV.RM_  = (*((UInt8*) (GV.EIP_+1))) & 0x7;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      if (GV.RM_ == 0x2) {
        pMyDisasm->Instruction.Category = CET_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "endbr64");
        #endif
        GV.EIP_+= GV.DECALAGE_EIP+2;
      }
      else if (GV.RM_ == 0x3) {
        pMyDisasm->Instruction.Category = CET_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "endbr32");
        #endif
        GV.EIP_+= GV.DECALAGE_EIP+2;
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+MISCELLANEOUS_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "hint_nop");
    #endif
    if (GV.OperandSize == 64) {
      GV.MemDecoration = Arg2qword;
    }
    else if (GV.OperandSize == 32) {
      GV.MemDecoration = Arg2dword;
    }
    else {
      GV.MemDecoration = Arg2word;
    }
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ;
    GV.EIP_ += GV.DECALAGE_EIP+2;
  }
}